

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void test_dry(vector<float,_std::allocator<float>_> *probs,
             vector<int,_std::allocator<int>_> *last_tokens,
             vector<float,_std::allocator<float>_> *expected_probs,float dry_multiplier,
             float dry_base,int dry_allowed_length,int dry_penalty_last_n,
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *seq_breakers)

{
  size_type sVar1;
  size_type sVar2;
  sampler_tester *psVar3;
  const_reference pvVar4;
  llama_sampler *sampler_00;
  int in_ECX;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  int in_R8D;
  vector *in_R9;
  float in_XMM0_Da;
  float in_XMM1_Da;
  size_t i;
  llama_sampler *sampler;
  sampler_tester tester;
  llama_sampler *in_stack_ffffffffffffff38;
  sampler_tester *in_stack_ffffffffffffff40;
  sampler_tester *this;
  ulong local_a0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa8;
  sampler_tester *in_stack_ffffffffffffffb0;
  
  sVar1 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
  sVar2 = std::vector<float,_std::allocator<float>_>::size(in_RDX);
  if (sVar1 != sVar2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
               ,0xa7,"GGML_ASSERT(%s) failed","probs.size() == expected_probs.size()");
  }
  sampler_tester::sampler_tester
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  psVar3 = (sampler_tester *)
           llama_sampler_init_dry_testing(0x400,in_XMM0_Da,in_XMM1_Da,in_ECX,in_R8D,in_R9);
  local_a0 = 0;
  this = psVar3;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if (sVar1 <= local_a0) break;
    in_stack_ffffffffffffff40 = psVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,local_a0);
    llama_sampler_accept(in_stack_ffffffffffffff40,*pvVar4);
    local_a0 = local_a0 + 1;
  }
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0xb1,"test_dry");
  dump(&in_stack_ffffffffffffff40->cur_p);
  printf("-\n");
  sampler_tester::apply(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  sampler_00 = (llama_sampler *)llama_sampler_init_dist(0);
  sampler_tester::apply(in_stack_ffffffffffffff40,sampler_00);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0xb4,"test_dry");
  dump(&in_stack_ffffffffffffff40->cur_p);
  printf("-\n");
  sampler_tester::check(this);
  sampler_tester::~sampler_tester(in_stack_ffffffffffffff40);
  return;
}

Assistant:

static void test_dry(
    const std::vector<float> & probs, const std::vector<llama_token> & last_tokens,
    const std::vector<float> & expected_probs, float dry_multiplier, float dry_base,
    int dry_allowed_length, int dry_penalty_last_n,
    const std::vector<std::vector<llama_token>> & seq_breakers
) {
    GGML_ASSERT(probs.size() == expected_probs.size());

    sampler_tester tester(probs, expected_probs);

    auto * sampler = llama_sampler_init_dry_testing(1024, dry_multiplier, dry_base, dry_allowed_length, dry_penalty_last_n, seq_breakers);

    for (size_t i = 0; i < last_tokens.size(); i++) {
        llama_sampler_accept(sampler, last_tokens[i]);
    }

    DUMP(&tester.cur_p);
    tester.apply(sampler);
    tester.apply(llama_sampler_init_dist(0));
    DUMP(&tester.cur_p);
    tester.check();
}